

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall kj::UnixEventPort::wake(UnixEventPort *this)

{
  int iVar1;
  ssize_t sVar2;
  Fault f;
  uint64_t one;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_18 = 1;
  do {
    sVar2 = ::write((this->eventFd).fd,&local_18,8);
    if (-1 < sVar2) {
      if (sVar2 == 8) {
        return;
      }
      local_30.exception = (Exception *)0x0;
      local_28 = 0;
      uStack_20 = 0;
      kj::_::Debug::Fault::init
                (&local_30,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_30);
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void UnixEventPort::wake() const {
  uint64_t one = 1;
  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = write(eventFd, &one, sizeof(one)));
  KJ_ASSERT(n < 0 || n == sizeof(one));
}